

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json.c
# Opt level: O3

int json_nscmp(lyd_node *node1,lyd_node *node2)

{
  char *pcVar1;
  char *pcVar2;
  bool bVar3;
  
  if (node1 != (lyd_node *)0x0 || node2 != (lyd_node *)0x0) {
    bVar3 = true;
    if (node1 != (lyd_node *)0x0 && node2 != (lyd_node *)0x0) {
      if ((node1->schema == (lysc_node *)0x0) || (node2->schema == (lysc_node *)0x0)) {
        pcVar1 = node_prefix(node1);
        pcVar2 = node_prefix(node2);
        bVar3 = pcVar1 != pcVar2 || (pcVar2 == (char *)0x0 || pcVar1 == (char *)0x0);
      }
      else {
        bVar3 = node1->schema->module != node2->schema->module;
      }
    }
    return (int)bVar3;
  }
  __assert_fail("node1 || node2",
                "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/printer_json.c"
                ,0xbd,"int json_nscmp(const struct lyd_node *, const struct lyd_node *)");
}

Assistant:

int
json_nscmp(const struct lyd_node *node1, const struct lyd_node *node2)
{
    assert(node1 || node2);

    if (!node1 || !node2) {
        return 1;
    } else if (node1->schema && node2->schema) {
        if (node1->schema->module == node2->schema->module) {
            /* belongs to the same module */
            return 0;
        } else {
            /* different modules */
            return 1;
        }
    } else {
        const char *pref1 = node_prefix(node1);
        const char *pref2 = node_prefix(node2);

        if ((pref1 && pref2) && (pref1 == pref2)) {
            return 0;
        } else {
            return 1;
        }
    }
}